

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O1

uint64_t basisu::color_cell_compression_est_astc
                   (uint32_t num_weights,uint32_t num_comps,uint32_t *pWeight_table,
                   uint32_t num_pixels,color_quad_u8 *pPixels,uint64_t best_err_so_far,
                   uint32_t *weights)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint32_t uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  undefined1 in_XMM0 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar23;
  uint uVar26;
  undefined1 in_XMM2 [16];
  undefined4 uVar27;
  uint uVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint uVar31;
  uint uVar32;
  undefined1 in_XMM3 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  color_quad_u8 weightedColors [32];
  int thresh [31];
  int dots [32];
  undefined4 local_1b8;
  undefined1 local_1b4 [124];
  int aiStack_138 [32];
  int aiStack_b8 [34];
  ulong uVar10;
  
  if (1 < num_comps - 3) {
    __assert_fail("num_comps == 3 || num_comps == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6ef,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  uVar9 = num_weights - 1;
  uVar10 = (ulong)uVar9;
  if (0x1f < uVar9) {
    __assert_fail("num_weights >= 1 && num_weights <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6f0,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  if ((*pWeight_table != 0) || (pWeight_table[uVar10] != 0x40)) {
    __assert_fail("pWeight_table[0] == 0 && pWeight_table[num_weights - 1] == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6f1,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  if (num_comps == 4) {
    if (num_pixels == 0) {
      auVar24 = pmovzxbd(in_XMM3,0xffffffff);
      auVar22 = (undefined1  [16])0x0;
    }
    else {
      auVar29 = pmovzxbd(in_XMM3,0xffffffff);
      uVar12 = 0;
      auVar20 = (undefined1  [16])0x0;
      do {
        in_XMM0 = pmovzxbd(in_XMM0,*(undefined4 *)pPixels[uVar12].m_c);
        uVar26 = in_XMM0._0_4_;
        uVar28 = auVar29._0_4_;
        auVar24._0_4_ = (uVar26 < uVar28) * uVar26 | (uVar26 >= uVar28) * uVar28;
        uVar28 = in_XMM0._4_4_;
        uVar31 = auVar29._4_4_;
        auVar24._4_4_ = (uVar28 < uVar31) * uVar28 | (uVar28 >= uVar31) * uVar31;
        uVar31 = in_XMM0._8_4_;
        uVar32 = auVar29._8_4_;
        uVar23 = auVar29._12_4_;
        auVar24._8_4_ = (uVar31 < uVar32) * uVar31 | (uVar31 >= uVar32) * uVar32;
        uVar32 = in_XMM0._12_4_;
        auVar24._12_4_ = (uVar32 < uVar23) * uVar32 | (uVar32 >= uVar23) * uVar23;
        uVar23 = auVar20._0_4_;
        auVar22._0_4_ = (uVar23 < uVar26) * uVar26 | (uVar23 >= uVar26) * uVar23;
        uVar26 = auVar20._4_4_;
        auVar22._4_4_ = (uVar26 < uVar28) * uVar28 | (uVar26 >= uVar28) * uVar26;
        uVar26 = auVar20._8_4_;
        uVar28 = auVar20._12_4_;
        auVar22._8_4_ = (uVar26 < uVar31) * uVar31 | (uVar26 >= uVar31) * uVar26;
        auVar22._12_4_ = (uVar28 < uVar32) * uVar32 | (uVar28 >= uVar32) * uVar28;
        uVar12 = uVar12 + 1;
        auVar20 = auVar22;
        auVar29 = auVar24;
      } while (num_pixels != uVar12);
    }
  }
  else if (num_pixels == 0) {
    auVar24 = pmovzxbd(in_XMM3,0xffffffff);
    auVar22 = pmovzxbd(in_XMM2,0xff000000);
  }
  else {
    uVar12 = 0;
    uVar26 = 0xff;
    uVar28 = 0xff;
    uVar31 = 0xff;
    uVar32 = 0;
    uVar15 = 0;
    uVar23 = 0;
    do {
      bVar1 = pPixels[uVar12].m_c[0];
      if (bVar1 <= uVar26) {
        uVar26 = (uint)bVar1;
      }
      bVar2 = pPixels[uVar12].m_c[1];
      if (bVar2 <= uVar28) {
        uVar28 = (uint)bVar2;
      }
      bVar3 = pPixels[uVar12].m_c[2];
      if (bVar3 <= uVar31) {
        uVar31 = (uint)bVar3;
      }
      uVar8 = (uint)bVar1;
      if (bVar1 < uVar32) {
        uVar8 = uVar32;
      }
      uVar32 = uVar8;
      uVar8 = (uint)bVar2;
      if (bVar2 < uVar15) {
        uVar8 = uVar15;
      }
      uVar15 = uVar8;
      uVar8 = (uint)bVar3;
      if (bVar3 < uVar23) {
        uVar8 = uVar23;
      }
      uVar23 = uVar8;
      uVar12 = uVar12 + 1;
    } while (num_pixels != uVar12);
    auVar20 = pmovzxbd(in_XMM2,0xffffffff);
    auVar24._4_4_ = uVar28;
    auVar24._0_4_ = uVar26;
    auVar24._8_8_ = auVar20._8_8_ & 0xffffffff00000000 | (ulong)uVar31;
    auVar22._4_4_ = uVar15;
    auVar22._0_4_ = uVar32;
    auVar22._8_8_ = auVar20._8_8_ & 0xffffffff00000000 | (ulong)uVar23;
  }
  auVar20 = pmovzxbd(in_XMM0,0xffffffff);
  auVar29 = auVar24 & auVar20;
  bVar1 = auVar24[8];
  bVar2 = auVar24[4];
  bVar3 = auVar24[0];
  local_1b8 = (uint)bVar1 << 0x10 | auVar24._12_4_ * 0x1000000 | (uint)bVar2 << 8 | (uint)bVar3;
  auVar20 = auVar20 & auVar22;
  bVar5 = auVar22[8];
  bVar6 = auVar22[4];
  bVar7 = auVar22[0];
  *(uint *)(local_1b4 + uVar10 * 4 + -4) =
       (uint)bVar5 << 0x10 | auVar22._12_4_ * 0x1000000 | (uint)bVar6 << 8 | (uint)bVar7;
  uVar28 = auVar29._12_4_;
  uVar26 = auVar20._12_4_;
  if (1 < uVar9) {
    lVar19 = 0;
    do {
      uVar4 = pWeight_table[lVar19 + 1];
      iVar16 = 0x40 - uVar4;
      *(char *)(aiStack_138 + lVar19 + -0x1f) =
           (char)(uVar4 * CONCAT11(bVar7,bVar7) + iVar16 * (uint)CONCAT11(bVar3,bVar3) + 0x20 >> 0xe
                 );
      *(char *)((long)aiStack_138 + lVar19 * 4 + -0x7b) =
           (char)(iVar16 * (uint)CONCAT11(bVar2,bVar2) + uVar4 * CONCAT11(bVar6,bVar6) + 0x20 >> 0xe
                 );
      *(char *)((long)aiStack_138 + lVar19 * 4 + -0x7a) =
           (char)(uVar4 * CONCAT11(bVar5,bVar5) + iVar16 * (uint)CONCAT11(bVar1,bVar1) + 0x20 >> 0xe
                 );
      uVar14 = 0xff;
      if (num_comps == 4) {
        uVar14 = (undefined1)
                 (uVar4 * (uVar26 * 0x100 | uVar26) + iVar16 * (uVar28 * 0x100 | uVar28) + 0x20 >>
                 0xe);
      }
      *(undefined1 *)((long)aiStack_138 + lVar19 * 4 + -0x79) = uVar14;
      lVar19 = lVar19 + 1;
    } while (uVar10 - 1 != lVar19);
  }
  auVar21._0_4_ = auVar20._0_4_ - auVar29._0_4_;
  auVar21._4_4_ = auVar20._4_4_ - auVar29._4_4_;
  auVar21._8_4_ = auVar20._8_4_ - auVar29._8_4_;
  auVar21._12_4_ = uVar26 - uVar28;
  if (num_comps == 4) {
    if (num_weights != 0) {
      uVar12 = 0;
      do {
        auVar22 = pmovzxbd(auVar29,*(undefined4 *)(local_1b4 + uVar12 * 4 + -4));
        auVar22 = pmaddwd(auVar22,auVar21);
        auVar22 = phaddd(auVar22,auVar22);
        auVar29 = phaddd(auVar22,auVar22);
        aiStack_b8[uVar12] = auVar29._0_4_;
        uVar12 = uVar12 + 1;
      } while (num_weights != uVar12);
    }
  }
  else {
    if (auVar22._12_4_ != auVar24._12_4_) {
      __assert_fail("aa == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                    ,0x736,
                    "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                   );
    }
    if (num_weights != 0) {
      uVar12 = 0;
      do {
        aiStack_b8[uVar12] =
             (uint)(byte)local_1b4[uVar12 * 4 + -2] * auVar21._8_4_ +
             (uint)(byte)local_1b4[uVar12 * 4 + -3] * auVar21._4_4_ +
             (uint)(byte)local_1b4[uVar12 * 4 + -4] * auVar21._0_4_;
        uVar12 = uVar12 + 1;
      } while (num_weights != uVar12);
    }
  }
  if (uVar9 != 0) {
    uVar12 = 0;
    do {
      aiStack_138[uVar12] = aiStack_b8[uVar12] + aiStack_b8[uVar12 + 1] + 1 >> 1;
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  auVar22 = *(undefined1 (*) [16])weights;
  auVar20._0_8_ = auVar22._8_8_;
  auVar20._8_4_ = auVar22._8_4_;
  auVar20._12_4_ = auVar22._12_4_;
  auVar20 = auVar20 | auVar22;
  uVar27 = auVar20._4_4_;
  auVar29._4_4_ = uVar27;
  auVar29._0_4_ = uVar27;
  auVar29._8_4_ = uVar27;
  auVar29._12_4_ = uVar27;
  auVar30 = auVar29 | auVar20;
  if (auVar30._0_4_ == 1) {
    if (num_comps == 4) {
      uVar12 = 0;
      if (num_pixels != 0) {
        uVar11 = 0;
        do {
          auVar22 = pmovzxbd(auVar22,*(undefined4 *)pPixels[uVar12].m_c);
          if (1 < (int)num_weights) {
            auVar24 = pmaddwd(auVar21,auVar22);
            auVar20 = phaddd(auVar24,auVar24);
            uVar13 = uVar10;
            do {
              if (aiStack_138[(int)uVar13 - 1] <= auVar24._12_4_ + auVar24._8_4_ + auVar20._0_4_)
              goto LAB_00211572;
              uVar13 = uVar13 - 1;
            } while (0 < (int)uVar13);
          }
          uVar13 = 0;
LAB_00211572:
          auVar24 = pmovzxbd(auVar20,*(undefined4 *)(local_1b4 + uVar13 * 4 + -4));
          auVar25._0_4_ = auVar24._0_4_ - auVar22._0_4_;
          auVar25._4_4_ = auVar24._4_4_ - auVar22._4_4_;
          auVar25._8_4_ = auVar24._8_4_ - auVar22._8_4_;
          auVar25._12_4_ = auVar24._12_4_ - auVar22._12_4_;
          auVar24 = pmulld(auVar25,auVar25);
          auVar24 = phaddd(auVar24,auVar24);
          auVar20 = phaddd(auVar24,auVar24);
          uVar11 = uVar11 + auVar20._0_4_;
          if (best_err_so_far < uVar11) {
            return uVar11;
          }
          uVar9 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar9;
          if (uVar9 == num_pixels) {
            return uVar11;
          }
        } while( true );
      }
    }
    else {
      uVar12 = 0;
      if (num_pixels != 0) {
        uVar11 = 0;
        do {
          if (1 < (int)num_weights) {
            uVar13 = uVar10;
            do {
              if (aiStack_138[(int)uVar13 - 1] <=
                  (int)(auVar21._8_4_ * (uint)pPixels[uVar12].m_c[2] +
                       auVar21._4_4_ * (uint)pPixels[uVar12].m_c[1] +
                       auVar21._0_4_ * (uint)pPixels[uVar12].m_c[0])) goto LAB_002116c7;
              uVar13 = uVar13 - 1;
            } while (0 < (int)uVar13);
          }
          uVar13 = 0;
LAB_002116c7:
          iVar17 = (uint)(byte)local_1b4[uVar13 * 4 + -4] - (uint)pPixels[uVar12].m_c[0];
          iVar18 = (uint)(byte)local_1b4[uVar13 * 4 + -3] - (uint)pPixels[uVar12].m_c[1];
          iVar16 = (uint)(byte)local_1b4[uVar13 * 4 + -2] - (uint)pPixels[uVar12].m_c[2];
          uVar11 = uVar11 + (uint)(iVar16 * iVar16 + iVar18 * iVar18 + iVar17 * iVar17);
          if (best_err_so_far < uVar11) {
            return uVar11;
          }
          uVar9 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar9;
          if (uVar9 == num_pixels) {
            return uVar11;
          }
        } while( true );
      }
    }
  }
  else if (num_comps == 4) {
    uVar12 = 0;
    if (num_pixels != 0) {
      uVar11 = 0;
      do {
        auVar24 = pmovzxbd(auVar20,*(undefined4 *)pPixels[uVar12].m_c);
        if (1 < (int)num_weights) {
          auVar20 = pmaddwd(auVar21,auVar24);
          auVar30 = phaddd(auVar20,auVar20);
          uVar13 = uVar10;
          do {
            if (aiStack_138[(int)uVar13 - 1] <= auVar20._12_4_ + auVar20._8_4_ + auVar30._0_4_)
            goto LAB_00211611;
            uVar13 = uVar13 - 1;
          } while (0 < (int)uVar13);
        }
        uVar13 = 0;
LAB_00211611:
        auVar20 = pmovzxbd(auVar30,*(undefined4 *)(local_1b4 + uVar13 * 4 + -4));
        auVar30._0_4_ = auVar20._0_4_ - auVar24._0_4_;
        auVar30._4_4_ = auVar20._4_4_ - auVar24._4_4_;
        auVar30._8_4_ = auVar20._8_4_ - auVar24._8_4_;
        auVar30._12_4_ = auVar20._12_4_ - auVar24._12_4_;
        auVar24 = pmulld(auVar30,auVar22);
        auVar24 = pmulld(auVar24,auVar30);
        auVar24 = phaddd(auVar24,auVar24);
        auVar20 = phaddd(auVar24,auVar24);
        uVar11 = uVar11 + auVar20._0_4_;
        if (best_err_so_far < uVar11) {
          return uVar11;
        }
        uVar9 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar9;
        if (uVar9 == num_pixels) {
          return uVar11;
        }
      } while( true );
    }
  }
  else {
    uVar12 = 0;
    if (num_pixels != 0) {
      uVar11 = 0;
      do {
        if ((int)num_weights < 2) {
          uVar13 = 0;
        }
        else {
          uVar13 = uVar10;
          do {
            if (aiStack_138[(int)uVar13 - 1] <=
                (int)(auVar21._8_4_ * (uint)pPixels[uVar12].m_c[2] +
                     auVar21._4_4_ * (uint)pPixels[uVar12].m_c[1] +
                     auVar21._0_4_ * (uint)pPixels[uVar12].m_c[0])) goto LAB_002117a5;
            uVar13 = uVar13 - 1;
          } while (0 < (int)uVar13);
          uVar13 = 0;
        }
LAB_002117a5:
        iVar17 = (uint)(byte)local_1b4[uVar13 * 4 + -4] - (uint)pPixels[uVar12].m_c[0];
        iVar18 = (uint)(byte)local_1b4[uVar13 * 4 + -3] - (uint)pPixels[uVar12].m_c[1];
        iVar16 = (uint)(byte)local_1b4[uVar13 * 4 + -2] - (uint)pPixels[uVar12].m_c[2];
        uVar11 = uVar11 + (uint)(iVar16 * auVar22._8_4_ * iVar16 +
                                iVar18 * auVar22._4_4_ * iVar18 + iVar17 * auVar22._0_4_ * iVar17);
        if (best_err_so_far < uVar11) {
          return uVar11;
        }
        uVar9 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar9;
        if (uVar9 == num_pixels) {
          return uVar11;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

uint64_t color_cell_compression_est_astc(
	uint32_t num_weights, uint32_t num_comps, const uint32_t *pWeight_table,
	uint32_t num_pixels, const color_quad_u8* pPixels, 
	uint64_t best_err_so_far, const uint32_t weights[4])
{
	assert(num_comps == 3 || num_comps == 4);
	assert(num_weights >= 1 && num_weights <= 32);
	assert(pWeight_table[0] == 0 && pWeight_table[num_weights - 1] == 64);

	// Find RGB bounds as an approximation of the block's principle axis
	uint32_t lr = 255, lg = 255, lb = 255, la = 255;
	uint32_t hr = 0, hg = 0, hb = 0, ha = 0;
	if (num_comps == 4)
	{
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8* pC = &pPixels[i];
			if (pC->m_c[0] < lr) lr = pC->m_c[0];
			if (pC->m_c[1] < lg) lg = pC->m_c[1];
			if (pC->m_c[2] < lb) lb = pC->m_c[2];
			if (pC->m_c[3] < la) la = pC->m_c[3];

			if (pC->m_c[0] > hr) hr = pC->m_c[0];
			if (pC->m_c[1] > hg) hg = pC->m_c[1];
			if (pC->m_c[2] > hb) hb = pC->m_c[2];
			if (pC->m_c[3] > ha) ha = pC->m_c[3];
		}
	}
	else
	{
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8* pC = &pPixels[i];
			if (pC->m_c[0] < lr) lr = pC->m_c[0];
			if (pC->m_c[1] < lg) lg = pC->m_c[1];
			if (pC->m_c[2] < lb) lb = pC->m_c[2];

			if (pC->m_c[0] > hr) hr = pC->m_c[0];
			if (pC->m_c[1] > hg) hg = pC->m_c[1];
			if (pC->m_c[2] > hb) hb = pC->m_c[2];
		}
		la = 255;
		ha = 255;
	}

	color_quad_u8 lowColor, highColor;
	color_quad_u8_set(&lowColor, lr, lg, lb, la);
	color_quad_u8_set(&highColor, hr, hg, hb, ha);

	// Place endpoints at bbox diagonals and compute interpolated colors 
	color_quad_u8 weightedColors[32];

	weightedColors[0] = lowColor;
	weightedColors[num_weights - 1] = highColor;
	for (uint32_t i = 1; i < (num_weights - 1); i++)
	{
		weightedColors[i].m_c[0] = (uint8_t)astc_interpolate_linear(lowColor.m_c[0], highColor.m_c[0], pWeight_table[i]);
		weightedColors[i].m_c[1] = (uint8_t)astc_interpolate_linear(lowColor.m_c[1], highColor.m_c[1], pWeight_table[i]);
		weightedColors[i].m_c[2] = (uint8_t)astc_interpolate_linear(lowColor.m_c[2], highColor.m_c[2], pWeight_table[i]);
		weightedColors[i].m_c[3] = (num_comps == 4) ? (uint8_t)astc_interpolate_linear(lowColor.m_c[3], highColor.m_c[3], pWeight_table[i]) : 255;
	}

	// Compute dots and thresholds
	const int ar = highColor.m_c[0] - lowColor.m_c[0];
	const int ag = highColor.m_c[1] - lowColor.m_c[1];
	const int ab = highColor.m_c[2] - lowColor.m_c[2];
	const int aa = highColor.m_c[3] - lowColor.m_c[3];

	int dots[32];
	if (num_comps == 4)
	{
		for (uint32_t i = 0; i < num_weights; i++)
			dots[i] = weightedColors[i].m_c[0] * ar + weightedColors[i].m_c[1] * ag + weightedColors[i].m_c[2] * ab + weightedColors[i].m_c[3] * aa;
	}
	else
	{
		assert(aa == 0);
		for (uint32_t i = 0; i < num_weights; i++)
			dots[i] = weightedColors[i].m_c[0] * ar + weightedColors[i].m_c[1] * ag + weightedColors[i].m_c[2] * ab;
	}

	int thresh[32 - 1];
	for (uint32_t i = 0; i < (num_weights - 1); i++)
		thresh[i] = (dots[i] + dots[i + 1] + 1) >> 1;

	uint64_t total_err = 0;
	if ((weights[0] | weights[1] | weights[2] | weights[3]) == 1)
	{
		if (num_comps == 4)
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2] + aa * pC->m_c[3];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];
				int da = (int)pE1->m_c[3] - (int)pC->m_c[3];

				total_err += (dr * dr) + (dg * dg) + (db * db) + (da * da);
				if (total_err > best_err_so_far)
					break;
			}
		}
		else
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];

				total_err += (dr * dr) + (dg * dg) + (db * db);
				if (total_err > best_err_so_far)
					break;
			}
		}
	}
	else
	{
		if (num_comps == 4)
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2] + aa * pC->m_c[3];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];
				int da = (int)pE1->m_c[3] - (int)pC->m_c[3];

				total_err += weights[0] * (dr * dr) + weights[1] * (dg * dg) + weights[2] * (db * db) + weights[3] * (da * da);
				if (total_err > best_err_so_far)
					break;
			}
		}
		else
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];

				total_err += weights[0] * (dr * dr) + weights[1] * (dg * dg) + weights[2] * (db * db);
				if (total_err > best_err_so_far)
					break;
			}
		}
	}

	return total_err;
}